

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

char * tun_format(btbb_packet *pkt)

{
  int iVar1;
  uint32_t *puVar2;
  int i;
  long lVar3;
  long lVar4;
  uint8_t host_order;
  byte bVar5;
  char *pcVar6;
  uint8_t host_order_3;
  
  iVar1 = pkt->payload_length;
  puVar2 = (uint32_t *)malloc((long)iVar1 + 9);
  *puVar2 = pkt->clock;
  *(uint8_t *)(puVar2 + 1) = pkt->channel;
  *(byte *)((long)puVar2 + 5) = (byte)pkt->flags & 2 | (byte)(pkt->flags >> 5) & 1;
  lVar3 = 0;
  bVar5 = 0;
  do {
    bVar5 = bVar5 | pkt->packet_header[lVar3] << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  *(byte *)((long)puVar2 + 6) = bVar5;
  lVar3 = 0;
  bVar5 = 0;
  do {
    bVar5 = bVar5 | pkt->packet_header[lVar3 + 7] << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *(byte *)((long)puVar2 + 7) = bVar5;
  lVar3 = 0;
  bVar5 = 0;
  do {
    bVar5 = bVar5 | pkt->packet_header[lVar3 + 10] << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  *(byte *)(puVar2 + 2) = bVar5;
  if (0 < iVar1) {
    pcVar6 = pkt->payload;
    lVar3 = 0;
    do {
      lVar4 = 0;
      bVar5 = 0;
      do {
        bVar5 = bVar5 | pcVar6[lVar4] << ((byte)lVar4 & 0x1f);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      *(byte *)((long)puVar2 + lVar3 + 9) = bVar5;
      lVar3 = lVar3 + 1;
      pcVar6 = pcVar6 + 8;
    } while (lVar3 != iVar1);
  }
  return (char *)puVar2;
}

Assistant:

char *tun_format(btbb_packet* pkt)
{
	/* include 6 bytes for meta data, 3 bytes for packet header */
	int length = 9 + pkt->payload_length;
	char *tun_format = (char *) malloc(length);
	int i;

	/* meta data */
	tun_format[0] = pkt->clock & 0xff;
	tun_format[1] = (pkt->clock >> 8) & 0xff;
	tun_format[2] = (pkt->clock >> 16) & 0xff;
	tun_format[3] = (pkt->clock >> 24) & 0xff;
	tun_format[4] = pkt->channel;
	tun_format[5] = btbb_packet_get_flag(pkt, BTBB_CLK27_VALID) |
		(btbb_packet_get_flag(pkt, BTBB_NAP_VALID) << 1);

	/* packet header modified to fit byte boundaries */
	/* lt_addr and type */
	tun_format[6] = (char) air_to_host8(&pkt->packet_header[0], 7);
	/* flags */
	tun_format[7] = (char) air_to_host8(&pkt->packet_header[7], 3);
	/* HEC */
	tun_format[8] = (char) air_to_host8(&pkt->packet_header[10], 8);

	for(i=0;i<pkt->payload_length;i++)
		tun_format[i+9] = (char) air_to_host8(&pkt->payload[i*8], 8);

	return tun_format;
}